

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMessageCompact.h
# Opt level: O1

void __thiscall
nowtech::log::MessageCompact<8ul,true>::
output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
          (MessageCompact<8ul,true> *this,
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *aConverter)

{
  MessageCompact<8ul,true> aFill;
  MessageCompact<8ul,true> MVar1;
  MessageCompact<8ul,true> MVar2;
  ulong aBase;
  unsigned_long aValue;
  long aValue_00;
  
  MVar2 = this[0xc];
  if (0xe < (byte)MVar2 - 2) {
    return;
  }
  MVar1 = this[8];
  aBase = (ulong)(byte)MVar1;
  aFill = this[9];
  switch((uint)(byte)MVar2) {
  case 2:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::convert(aConverter,(bool)((byte)*this & 1),(uint8_t)MVar1,(uint8_t)aFill);
    return;
  case 3:
    goto switchD_00103996_caseD_3;
  case 4:
    goto switchD_00103996_caseD_4;
  case 5:
    goto switchD_00103996_caseD_5;
  case 6:
    aValue = (unsigned_long)(byte)*this;
    break;
  case 7:
    aValue = (unsigned_long)*(ushort *)this;
    break;
  case 8:
    aValue = (unsigned_long)*(uint *)this;
    break;
  case 9:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::append<unsigned_long>(aConverter,*(unsigned_long *)this,aBase,(uint8_t)aFill);
    goto LAB_00103a34;
  case 10:
    aValue_00 = (long)(char)*this;
    goto LAB_00103ab9;
  case 0xb:
    aValue_00 = (long)*(short *)this;
    goto LAB_00103ab9;
  case 0xc:
    aValue_00 = (long)*(int *)this;
LAB_00103ab9:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::append<long>(aConverter,aValue_00,aBase,(uint8_t)aFill);
    goto LAB_00103ac5;
  case 0xd:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::append<long>(aConverter,*(long *)this,aBase,(uint8_t)aFill);
LAB_00103a34:
    if (aConverter->mBegin < aConverter->mEnd) {
      *aConverter->mBegin = ' ';
      aConverter->mBegin = aConverter->mBegin + 1;
    }
    if (MVar2 != (MessageCompact<8ul,true>)0x4) {
      if (MVar2 != (MessageCompact<8ul,true>)0x3) {
        return;
      }
switchD_00103996_caseD_3:
      MVar1 = (MessageCompact<8ul,true>)0x8;
      if (aFill != (MessageCompact<8ul,true>)0x0) {
        MVar1 = aFill;
      }
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::append(aConverter,(longdouble)*(float *)this,(uint8_t)MVar1);
      if (aConverter->mBegin < aConverter->mEnd) {
        *aConverter->mBegin = ' ';
        aConverter->mBegin = aConverter->mBegin + 1;
      }
      if (MVar2 != (MessageCompact<8ul,true>)0x4) {
        return;
      }
    }
switchD_00103996_caseD_4:
    MVar2 = (MessageCompact<8ul,true>)0x10;
    if (aFill != (MessageCompact<8ul,true>)0x0) {
      MVar2 = aFill;
    }
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::append(aConverter,(longdouble)*(double *)this,(uint8_t)MVar2);
    goto LAB_00103ac5;
  case 0xe:
    if ((MessageCompact<8ul,true> *)aConverter->mBegin <
        (MessageCompact<8ul,true> *)aConverter->mEnd) {
      *(MessageCompact<8ul,true> *)aConverter->mBegin = *this;
      aConverter->mBegin = aConverter->mBegin + 1;
    }
    goto LAB_00103ac5;
  case 0xf:
    this = *(MessageCompact<8ul,true> **)this;
    goto LAB_001039e2;
  case 0x10:
LAB_001039e2:
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::convert(aConverter,(char *)this,(uint8_t)MVar1,(uint8_t)aFill);
    return;
  }
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
  ::append<unsigned_long>(aConverter,aValue,aBase,(uint8_t)aFill);
LAB_00103ac5:
  if (aConverter->mBegin < aConverter->mEnd) {
    *aConverter->mBegin = ' ';
    aConverter->mBegin = aConverter->mBegin + 1;
  }
switchD_00103996_caseD_5:
  return;
}

Assistant:

void output(tConverter& aConverter) const noexcept {
    Type type = static_cast<Type>(mData[csOffsetType]);
    uint8_t base = mData[csOffsetBase];
    uint8_t fill = mData[csOffsetFill];

    if(type == Type::cBool) {
      bool value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint8_t) {
      aConverter.convert(mData[csOffsetPayload], base, fill);
    }
    else if(type == Type::cUint16_t) {
      uint16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint32_t) {
      uint32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt8_t) {
      int8_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt16_t) {
      int16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt32_t) {
      int32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cChar) {
      char value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cCharArray) {
      char* value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cStoredChars) {
      aConverter.convert(reinterpret_cast<char const*>(mData + csOffsetPayload), base, fill);
    }
    else {
      if constexpr(csPayloadSize >= sizeof(int64_t) || sizeof(char*) > sizeof(int32_t)) {
        if(type == Type::cUint64_t) {
          uint64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else if(type == Type::cInt64_t) {
          int64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
      if constexpr(tSupportFloatingPoint) {
        if(type == Type::cFloat) {
          float value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
        if constexpr(csPayloadSize >= sizeof(double)) {
          if(type == Type::cDouble) {
            double value;
            std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
            aConverter.convert(value, base, fill);
          }
          else { // nothing to do
          }
          if constexpr(csPayloadSize >= sizeof(long double)) {
            if(type == Type::cLongDouble) {
              long double value;
              std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
              aConverter.convert(value, base, fill);
            }
            else { // nothing to do
            }
          }
          else { // nothing to do
          }
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
    }
  }